

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff.c
# Opt level: O0

lyd_diff_op lyd_diff_str2op(char *str)

{
  int iVar1;
  char *str_local;
  
  switch(*str) {
  case 'c':
    iVar1 = strcmp(str,"create");
    if (iVar1 != 0) {
      __assert_fail("!strcmp(str, \"create\")",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c",
                    0x5c,"enum lyd_diff_op lyd_diff_str2op(const char *)");
    }
    str_local._4_4_ = LYD_DIFF_OP_CREATE;
    break;
  case 'd':
    iVar1 = strcmp(str,"delete");
    if (iVar1 != 0) {
      __assert_fail("!strcmp(str, \"delete\")",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c",
                    0x5f,"enum lyd_diff_op lyd_diff_str2op(const char *)");
    }
    str_local._4_4_ = LYD_DIFF_OP_DELETE;
    break;
  default:
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c",0x69);
    str_local._4_4_ = LYD_DIFF_OP_CREATE;
    break;
  case 'n':
    iVar1 = strcmp(str,"none");
    if (iVar1 != 0) {
      __assert_fail("!strcmp(str, \"none\")",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c",
                    0x65,"enum lyd_diff_op lyd_diff_str2op(const char *)");
    }
    str_local._4_4_ = LYD_DIFF_OP_NONE;
    break;
  case 'r':
    iVar1 = strcmp(str,"replace");
    if (iVar1 != 0) {
      __assert_fail("!strcmp(str, \"replace\")",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c",
                    0x62,"enum lyd_diff_op lyd_diff_str2op(const char *)");
    }
    str_local._4_4_ = LYD_DIFF_OP_REPLACE;
  }
  return str_local._4_4_;
}

Assistant:

static enum lyd_diff_op
lyd_diff_str2op(const char *str)
{
    switch (str[0]) {
    case 'c':
        assert(!strcmp(str, "create"));
        return LYD_DIFF_OP_CREATE;
    case 'd':
        assert(!strcmp(str, "delete"));
        return LYD_DIFF_OP_DELETE;
    case 'r':
        assert(!strcmp(str, "replace"));
        return LYD_DIFF_OP_REPLACE;
    case 'n':
        assert(!strcmp(str, "none"));
        return LYD_DIFF_OP_NONE;
    }

    LOGINT(NULL);
    return 0;
}